

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

int __thiscall amrex::MLMG::bottomSolveWithCG(MLMG *this,Any *x,Any *b,Type type)

{
  int iVar1;
  Type in_ECX;
  MLCGSolver *in_RDI;
  int ret;
  MLCGSolver cg_solver;
  char (*in_stack_fffffffffffffdd8) [28];
  undefined4 in_stack_fffffffffffffde0;
  Type in_stack_fffffffffffffde4;
  MLLinOp *in_stack_fffffffffffffde8;
  MLMG *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  MLCGSolver *this_00;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  Print *in_stack_fffffffffffffe50;
  MLCGSolver local_50;
  Type local_1c;
  
  this_00 = &local_50;
  local_1c = in_ECX;
  MLCGSolver::MLCGSolver
            ((MLCGSolver *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
             in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  MLCGSolver::setSolver(this_00,local_1c);
  MLCGSolver::setVerbose(this_00,in_RDI->iter);
  MLCGSolver::setMaxIter(&local_50,*(int *)&in_RDI->field_0x2c);
  if (in_RDI->nghost == 1) {
    in_stack_fffffffffffffdfc =
         (**(code **)(**(long **)&in_RDI[1].mglev + 0x30))(*(long **)&in_RDI[1].mglev,0);
    MLCGSolver::setNGhost(&local_50,in_stack_fffffffffffffdfc);
  }
  iVar1 = MLCGSolver::solve(in_RDI,(Any *)CONCAT44(in_stack_fffffffffffffdfc,
                                                   in_stack_fffffffffffffdf8),
                            (Any *)in_stack_fffffffffffffdf0,(Real)in_stack_fffffffffffffde8,
                            (Real)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  if ((iVar1 != 0) && (1 < *(int *)&in_RDI->mlmg)) {
    OutStream();
    Print::Print((Print *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                 (ostream *)this_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                      in_stack_fffffffffffffdd8);
    Print::~Print(in_stack_fffffffffffffe50);
  }
  MLCGSolver::getNumIters(&local_50);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             (value_type *)in_stack_fffffffffffffdd8);
  MLCGSolver::~MLCGSolver(&local_50);
  return iVar1;
}

Assistant:

int
MLMG::bottomSolveWithCG (Any& x, const Any& b, MLCGSolver::Type type)
{
    MLCGSolver cg_solver(this, linop);
    cg_solver.setSolver(type);
    cg_solver.setVerbose(bottom_verbose);
    cg_solver.setMaxIter(bottom_maxiter);
    if (cf_strategy == CFStrategy::ghostnodes) cg_solver.setNGhost(linop.getNGrow());

    int ret = cg_solver.solve(x, b, bottom_reltol, bottom_abstol);
    if (ret != 0 && verbose > 1) {
        amrex::Print() << "MLMG: Bottom solve failed.\n";
    }
    m_niters_cg.push_back(cg_solver.getNumIters());
    return ret;
}